

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

void lm_trie_quant_write_bin(lm_trie_quant_t *quant,FILE *fp)

{
  size_t sVar1;
  undefined4 local_1c;
  FILE *pFStack_18;
  int dummy;
  FILE *fp_local;
  lm_trie_quant_t *quant_local;
  
  local_1c = 1;
  pFStack_18 = (FILE *)fp;
  fp_local = (FILE *)quant;
  fwrite(&local_1c,4,1,(FILE *)fp);
  sVar1 = fwrite(fp_local->_lock,4,fp_local->_offset,pFStack_18);
  if (sVar1 != fp_local->_offset) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
            ,199,"Failed to write %d quantization values\n",fp_local->_offset);
  }
  return;
}

Assistant:

void
lm_trie_quant_write_bin(lm_trie_quant_t * quant, FILE * fp)
{
    /* Before it was quantization type */
    int dummy = 1;
    fwrite(&dummy, sizeof(dummy), 1, fp);
    if (SWAP_LM_TRIE) {
        size_t i;
        for (i = 0; i < quant->nvalues; ++i) {
            float32 value = quant->values[i];
            SWAP_FLOAT32(&value);
            if (fwrite(&value, sizeof(value), 1, fp) != 1) {
                E_ERROR("Failed to write quantization value\n");
                return; /* WTF, FIXME */
            }
        }
    }
    else {
        if (fwrite(quant->values, sizeof(*quant->values),
                   quant->nvalues, fp) != quant->nvalues) {
            E_ERROR("Failed to write %d quantization values\n",
                    quant->nvalues);
        }
    }
}